

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool verbose;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint32_t iterations;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  long local_40;
  ulong local_38;
  
  uVar9 = 100000;
  local_40 = 1;
  local_38 = 0;
  verbose = false;
  do {
    iVar5 = getopt(argc,argv,"vhm:n:i:");
    auVar11 = in_ZMM0._0_16_;
    switch(iVar5) {
    case 0x68:
      iVar5 = 0;
      printf(" Try %s -n 100000 -i 15 -v \n",*argv);
      puts("-n is the number of 16-bit words ");
      puts("-i is the number of tests or iterations ");
      pcVar6 = "-v makes things verbose";
LAB_00112876:
      puts(pcVar6);
      return iVar5;
    case 0x69:
      iVar5 = atoi(_optarg);
      local_38 = (ulong)iVar5;
      break;
    case 0x6a:
    case 0x6b:
    case 0x6c:
switchD_0011265b_caseD_6a:
      abort();
    case 0x6d:
      local_40 = atoll(_optarg);
      break;
    case 0x6e:
      uVar9 = atoll(_optarg);
      break;
    default:
      if (iVar5 == -1) {
        if (uVar9 >> 0x20 != 0) {
          printf("setting n to %u \n",0xffffffffffffffff);
          uVar9 = 0xffffffff;
        }
        if (local_38 >> 0x20 != 0) {
          printf("setting iterations to %u \n",0xffffffffffffffff);
          local_38 = 0xffffffff;
        }
        uVar7 = uVar9 * local_40;
        uVar10 = 10;
        if (uVar7 < 1000000) {
          uVar10 = 100;
        }
        if (local_38 != 0) {
          uVar10 = local_38;
        }
        printf("n = %zu m = %zu \n",uVar9);
        printf("iterations = %zu \n",uVar10);
        if (uVar9 == 0) {
          iVar5 = 1;
          pcVar6 = "n cannot be zero.";
        }
        else {
          uVar3 = uVar7 * 2;
          if (uVar3 < 0x400) {
            printf("array size: %zu B\n");
          }
          else {
            auVar11 = vcvtusi2sd_avx512f(auVar11,uVar3);
            if (uVar3 < 0x100000) {
              dVar1 = 0.0009765625;
              pcVar6 = "array size: %.3f kB\n";
            }
            else {
              dVar1 = 9.5367431640625e-07;
              pcVar6 = "array size: %.3f MB\n";
            }
            printf(pcVar6,auVar11._0_8_ * dVar1);
          }
          iterations = (uint32_t)uVar10;
          measurepopcnt((uint32_t)uVar7,iterations,verbose);
          measureoverhead((uint32_t)uVar7,iterations,verbose);
          for (lVar8 = 0; lVar8 != 0x130; lVar8 = lVar8 + 8) {
            uVar2 = *(undefined8 *)((long)pospopcnt_u16_method_names + lVar8);
            printf("%-40s\t",uVar2);
            fflush((FILE *)0x0);
            bVar4 = benchmarkMany((uint32_t)uVar9,(uint32_t)local_40,iterations,
                                  *(pospopcnt_u16_method_type *)
                                   ((long)pospopcnt_u16_methods + lVar8),verbose,true);
            if (!bVar4) {
              printf("Problem detected with %s.\n",uVar2);
            }
            if (verbose) {
              putchar(10);
            }
          }
          iVar5 = 0;
          if (verbose != false) {
            return 0;
          }
          pcVar6 = "Try -v to get more details.";
        }
        goto LAB_00112876;
      }
      if (iVar5 != 0x76) goto switchD_0011265b_caseD_6a;
      verbose = true;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    int c;

    while ((c = getopt(argc, argv, "vhm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    printf("n = %zu m = %zu \n", n, m);
    printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    if(array_in_bytes < 1024) {
      printf("array size: %zu B\n", array_in_bytes);
    } else if (array_in_bytes < 1024 * 1024) {
      printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    } else {
      printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    }

#if POSPOPCNT_SIMD_VERSION >= 5
    measurepopcnt(n*m, iterations, verbose);
#endif
    measureoverhead(n*m, iterations, verbose);
   
    for (size_t k = 0; k < PPOPCNT_NUMBER_METHODS; k++) {
        printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(n, m, iterations, pospopcnt_u16_methods[k], verbose, true);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        if (verbose)
            printf("\n");
    }

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}